

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteSFixed64Array
               (int64 *a,int n,CodedOutputStream *output)

{
  uint8 *puVar1;
  size_t __n;
  
  puVar1 = output->cur_;
  __n = (size_t)(n << 3);
  if ((long)(output->impl_).end_ - (long)puVar1 < (long)__n) {
    puVar1 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,a,n << 3,puVar1);
  }
  else {
    memcpy(puVar1,a,__n);
    puVar1 = puVar1 + __n;
  }
  output->cur_ = puVar1;
  return;
}

Assistant:

void WireFormatLite::WriteSFixed64Array(const int64* a, int n,
                                        io::CodedOutputStream* output) {
  WriteArray<int64>(a, n, output);
}